

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O2

uint crnlib::rg_etc1::pack_etc1_block
               (void *pETC1_block,uint *pSrc_pixels_rgba,etc1_pack_params *pack_params)

{
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 *paVar1;
  uint *puVar2;
  ushort uVar3;
  uint64 uVar4;
  etc1_optimizer *peVar5;
  byte bVar6;
  int iVar7;
  color_quad_u8 *pcVar8;
  ushort *puVar9;
  ulong uVar10;
  ushort uVar11;
  int ch;
  uint uVar12;
  int iVar13;
  long lVar14;
  uint8 (*pauVar15) [8];
  ulong uVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  etc1_optimizer *peVar23;
  uint uVar24;
  ulong uVar25;
  byte bVar26;
  uint uVar27;
  long lVar28;
  component_t cVar29;
  ushort uVar30;
  float fVar31;
  etc1_optimizer *peVar32;
  ushort uVar33;
  uint uVar34;
  results *prVar35;
  uint use_color4;
  int iVar36;
  bool bVar37;
  int local_34c;
  uint local_334;
  uint local_330;
  uint local_32c;
  color_quad_u8 subblock_pixels [8];
  uint8 best_selectors [2] [8];
  ulong local_2b8;
  etc1_pack_params local_2a0;
  undefined4 local_298;
  color_quad_u8 *local_290;
  undefined1 local_288;
  int *local_280;
  undefined4 local_278;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aStack_274;
  undefined1 local_270 [8];
  results results [3];
  undefined8 local_1e0;
  uint8 (*local_1d0 [3]) [8];
  byte local_1b8;
  byte bStack_1b7;
  byte bStack_1b6;
  uint uStack_1b4;
  undefined4 local_1b0;
  uint8 (*local_1a8) [8];
  etc1_optimizer optimizer;
  uint8 selectors [3] [8];
  color_quad_u8 dithered_pixels [16];
  
  uVar12 = 0xf;
  uVar22 = 0xf;
  do {
    bVar37 = uVar12 == 0;
    uVar12 = uVar12 - 1;
    if (bVar37) {
      uVar12 = 0;
      uVar18 = 0;
      uVar27 = 0;
      uVar16 = 0;
      uVar24 = 0xffffffff;
      uVar22 = 0;
      while (uVar10 = uVar22, uVar10 != 3) {
        for (iVar20 = -1; uVar22 = uVar10 + 1, iVar20 != 2; iVar20 = iVar20 + 1) {
          iVar13 = iVar20 + (uint)*(byte *)((long)pSrc_pixels_rgba + uVar10);
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          if (iVar13 < 1) {
            iVar13 = 0;
          }
          puVar9 = &g_color8_to_etc_block_config_0_255;
          if (iVar13 != 0) {
            if (iVar13 == 0xff) {
              puVar9 = &DAT_00197a22;
            }
            else {
              puVar9 = (ushort *)
                       (g_color8_to_etc_block_config_1_to_254 + (long)(iVar13 + -1) * 0x18);
            }
          }
          iVar13 = iVar13 - (uint)*(byte *)((long)pSrc_pixels_rgba + uVar10);
          uVar33 = *puVar9;
          do {
            puVar9 = puVar9 + 1;
            uVar11 = *(ushort *)
                      (g_etc1_inverse_lookup +
                      (ulong)*(byte *)((long)pSrc_pixels_rgba +
                                      (ulong)(uint)(&
                                                  pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                                  ::s_next_comp)[uVar10]) * 2 +
                      (ulong)(byte)uVar33 * 0x200);
            uVar3 = *(ushort *)
                     (g_etc1_inverse_lookup +
                     (ulong)*(byte *)((long)pSrc_pixels_rgba + (ulong)(uint)(&DAT_00195a44)[uVar10])
                     * 2 + (ulong)(byte)uVar33 * 0x200);
            uVar21 = (uint)(uVar11 >> 8);
            uVar34 = (uint)(uVar3 >> 8);
            uVar21 = uVar34 * uVar34 + uVar21 * uVar21 + iVar13 * iVar13;
            if (uVar21 < uVar24) {
              uVar18 = uVar11 & 0xff;
              uVar12 = uVar3 & 0xff;
              if (uVar21 == 0) {
                uVar22 = 0;
                uVar16 = uVar10;
                uVar27 = (uint)uVar33;
                goto LAB_0017eced;
              }
              uVar27 = (uint)uVar33;
              uVar16 = uVar10 & 0xffffffff;
              uVar24 = uVar21;
            }
            uVar33 = *puVar9;
          } while (uVar33 != 0xffff);
        }
      }
      uVar22 = (ulong)(uVar24 << 4);
LAB_0017eced:
      *(byte *)((long)pETC1_block + 3) =
           ((byte)(uVar27 >> 1) & 7) * '$' + (char)(uVar27 & 1) * '\x02';
      bVar6 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)(uVar27 >> 4 & 3));
      *(short *)((long)pETC1_block + 4) = (short)((int)((uint)bVar6 << 0x1e) >> 0x1f);
      *(ushort *)((long)pETC1_block + 6) = -(bVar6 & 1);
      if ((uVar27 & 1) == 0) {
        *(byte *)((long)pETC1_block + (uVar16 & 0xffffffff)) =
             (byte)((uVar27 >> 8) << 4) | (byte)(uVar27 >> 8);
        *(byte *)((long)pETC1_block +
                 (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                ::s_next_comp)[uVar16 & 0xffffffff]) =
             (byte)(uVar18 << 4) | (byte)uVar18;
        bVar6 = (byte)(uVar12 << 4) | (byte)uVar12;
      }
      else {
        *(char *)((long)pETC1_block + (uVar16 & 0xffffffff)) = (char)((uVar27 >> 8) << 3);
        *(byte *)((long)pETC1_block +
                 (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                ::s_next_comp)[uVar16 & 0xffffffff]) = (byte)uVar18 << 3;
        bVar6 = (byte)uVar12 << 3;
      }
      *(byte *)((long)pETC1_block +
               (ulong)(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                              ::s_next_comp)[(int)uVar16 + 1]) = bVar6;
      goto LAB_0017f6aa;
    }
    puVar2 = pSrc_pixels_rgba + uVar22;
    uVar22 = (ulong)uVar12;
  } while (*puVar2 == *pSrc_pixels_rgba);
  if (pack_params->m_dithering == true) {
    peVar32 = (etc1_optimizer *)&optimizer.m_limit;
    pcVar8 = dithered_pixels;
    dithered_pixels[0].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[1].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[2].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[3].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[4].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[5].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[6].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[7].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[8].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[9].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[10].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[0xb].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[0xc].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[0xd].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[0xe].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    dithered_pixels[0xf].field_0 =
         (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
         (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)0xffffffff;
    peVar23 = &optimizer;
    for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
      optimizer.m_limit = 0;
      optimizer.m_avg_color.m_s[0] = 0.0;
      optimizer.m_avg_color.m_s[1] = 0.0;
      optimizer.m_avg_color.m_s[2] = 0.0;
      optimizer.m_pParams = (params *)0x0;
      optimizer.m_pResult = (results *)0x0;
      peVar5 = peVar23;
      for (lVar28 = 0; peVar23 = peVar5, (int)lVar28 != 0x40; lVar28 = lVar28 + 0x10) {
        bVar6 = *(byte *)((long)pSrc_pixels_rgba + lVar28);
        bVar26 = (&DAT_001d4a48)
                 [(long)(*(int *)&peVar32->m_pParams * 5 +
                         (int)((vec3F *)((long)&peVar32->m_pParams + 4))->m_s[0] * 3 >> 4) +
                  (ulong)bVar6];
        (pcVar8->field_0).c[lVar28] = bVar26;
        iVar20 = (uint)bVar6 - (uint)bVar26;
        *(int *)&peVar23->m_pParams = iVar20;
        bVar6 = *(byte *)((long)pSrc_pixels_rgba + lVar28 + 4);
        bVar26 = (&DAT_001d4a48)
                 [(long)((int)((vec3F *)((long)&peVar32->m_pParams + 4))->m_s[0] * 5 +
                         *(int *)&peVar32->m_pResult * 3 + iVar20 * 7 + *(int *)&peVar32->m_pParams
                        >> 4) + (ulong)bVar6];
        pcVar8[1].field_0.c[lVar28] = bVar26;
        fVar31 = (float)((uint)bVar6 - (uint)bVar26);
        ((vec3F *)((long)&peVar23->m_pParams + 4))->m_s[0] = fVar31;
        bVar6 = *(byte *)((long)pSrc_pixels_rgba + lVar28 + 8);
        bVar26 = (&DAT_001d4a48)
                 [(long)(*(int *)&peVar32->m_pResult * 5 +
                         (int)*(float *)((long)&peVar32->m_pResult + 4) * 3 + (int)fVar31 * 7 +
                         (int)((vec3F *)((long)&peVar32->m_pParams + 4))->m_s[0] >> 4) +
                  (ulong)bVar6];
        pcVar8[2].field_0.c[lVar28] = bVar26;
        iVar20 = (uint)bVar6 - (uint)bVar26;
        *(int *)&peVar23->m_pResult = iVar20;
        bVar6 = *(byte *)((long)pSrc_pixels_rgba + lVar28 + 0xc);
        bVar26 = (&DAT_001d4a48)
                 [(long)((int)*(float *)((long)&peVar32->m_pResult + 4) * 5 + iVar20 * 7 +
                         *(int *)&peVar32->m_pResult >> 4) + (ulong)bVar6];
        pcVar8[3].field_0.c[lVar28] = bVar26;
        *(uint *)((long)&peVar23->m_pResult + 4) = (uint)bVar6 - (uint)bVar26;
        peVar5 = peVar32;
        peVar32 = peVar23;
      }
      pSrc_pixels_rgba = (uint *)((long)pSrc_pixels_rgba + 1);
      pcVar8 = (color_quad_u8 *)((long)&pcVar8->field_0 + 1);
    }
    pSrc_pixels_rgba = (uint *)dithered_pixels;
  }
  optimizer.m_best_solution.m_coords.m_color4 = false;
  optimizer.m_best_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  optimizer.m_best_solution.m_coords.m_inten_table = 0;
  optimizer.m_best_solution.m_error = 0xffffffffffffffff;
  optimizer.m_best_solution.m_valid = false;
  optimizer.m_trial_solution.m_coords.m_color4 = false;
  optimizer.m_trial_solution.m_coords.m_unscaled_color.field_0 =
       (anon_union_4_3_dd316fa8_for_color_quad_u8_0)0x0;
  optimizer.m_trial_solution.m_coords.m_inten_table = 0;
  optimizer.m_trial_solution.m_error = 0xffffffffffffffff;
  optimizer.m_trial_solution.m_valid = false;
  optimizer.m_pParams = (params *)0x0;
  optimizer.m_pResult = (results *)0x0;
  optimizer.m_pSorted_luma_indices = (uint32 *)0x0;
  optimizer.m_pSorted_luma = (uint32 *)0x0;
  local_1d0[0] = best_selectors;
  local_1b0 = 8;
  local_1a8 = best_selectors + 1;
  pauVar15 = selectors;
  for (lVar14 = 3; lVar14 != 0x12; lVar14 = lVar14 + 5) {
    *(undefined4 *)(local_270 + lVar14 * 8) = 8;
    (&results[0].m_error)[lVar14] = (uint64)pauVar15;
    pauVar15 = pauVar15 + 1;
  }
  local_2a0 = *pack_params;
  local_288 = 0;
  local_280 = (int *)&etc1_optimizer::params::clear_optimizer_params()::s_default_scan_delta;
  local_278 = 1;
  aStack_274.m_u32 = 0;
  local_270[0] = 0;
  local_298 = 8;
  local_290 = subblock_pixels;
  uVar22 = 0xffffffffffffffff;
  iVar20 = 0;
  local_34c = 0;
  for (iVar13 = 0; iVar13 != 2; iVar13 = iVar13 + 1) {
    for (iVar36 = 0; iVar36 != 2; iVar36 = iVar36 + 1) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        if (lVar14 == 2) {
          local_1e0 = CONCAT44(results[0].m_block_inten_table,
                               results[0].m_block_color_unscaled.field_0);
          memcpy(best_selectors,results[0].m_pSelectors,(ulong)results[0].m_n);
          _local_1b8 = results[1].m_block_color_unscaled.field_0;
          uStack_1b4 = results[1].m_block_inten_table;
          memcpy(best_selectors + 1,results[1].m_pSelectors,(ulong)results[1].m_n);
          uVar22 = uVar16;
          local_34c = iVar13;
          iVar20 = iVar36;
          break;
        }
        if (iVar13 == 0) {
          subblock_pixels[0].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2].field_0.m_u32;
          subblock_pixels[1].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2 + 4].field_0.m_u32;
          subblock_pixels[2].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2 + 8].field_0.m_u32;
          subblock_pixels[3].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2 + 0xc].field_0.m_u32;
          subblock_pixels[4].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2 + 1].field_0.m_u32;
          subblock_pixels[5].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2 + 5].field_0.m_u32;
          subblock_pixels[6].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2 + 9].field_0.m_u32;
          subblock_pixels[7].field_0 =
               (anon_union_4_3_dd316fa8_for_color_quad_u8_0)
               ((color_quad_u8 *)pSrc_pixels_rgba)[lVar14 * 2 + 0xd].field_0.m_u32;
        }
        else {
          subblock_pixels._16_8_ =
               *(undefined8 *)((color_quad_u8 *)pSrc_pixels_rgba + lVar14 * 8 + 4);
          subblock_pixels._24_8_ =
               *(undefined8 *)((color_quad_u8 *)pSrc_pixels_rgba + lVar14 * 8 + 4 + 2);
          subblock_pixels._0_8_ = *(undefined8 *)((color_quad_u8 *)pSrc_pixels_rgba + lVar14 * 8);
          subblock_pixels._8_8_ =
               *(undefined8 *)((color_quad_u8 *)pSrc_pixels_rgba + lVar14 * 8 + 2);
        }
        results[2].m_error = 0xffffffffffffffff;
        if ((iVar36 != 0 || (int)lVar14 != 0) && 0 < (int)local_2a0.m_quality) {
          uVar12 = 7;
          uVar10 = 7;
LAB_0017ef6a:
          bVar37 = uVar12 != 0;
          uVar12 = uVar12 - 1;
          if (bVar37) goto code_r0x0017ef6f;
          pcVar8 = (color_quad_u8 *)0x0;
          if (lVar14 != 0 && iVar36 == 0) {
            pcVar8 = &results[0].m_block_color_unscaled;
          }
          local_32c = 0;
          local_330 = 0;
          local_334 = 0;
          local_2b8 = 0;
          uVar12 = 0xffffffff;
          uVar10 = 0;
          while (uVar25 = uVar10, uVar25 != 3) {
            for (iVar7 = -1; uVar10 = uVar25 + 1, iVar7 != 2; iVar7 = iVar7 + 1) {
              iVar19 = iVar7 + (uint)subblock_pixels[0].field_0.c[uVar25];
              if (0xfe < iVar19) {
                iVar19 = 0xff;
              }
              if (iVar19 < 1) {
                iVar19 = 0;
              }
              puVar9 = &g_color8_to_etc_block_config_0_255;
              if (iVar19 != 0) {
                if (iVar19 == 0xff) {
                  puVar9 = &DAT_00197a22;
                }
                else {
                  puVar9 = (ushort *)
                           (g_color8_to_etc_block_config_1_to_254 + (long)(iVar19 + -1) * 0x18);
                }
              }
              iVar19 = iVar19 - (uint)subblock_pixels[0].field_0.c[uVar25];
              uVar33 = *puVar9;
              do {
                puVar9 = puVar9 + 1;
                bVar6 = (byte)uVar33;
                if ((iVar36 == 0) == (bool)(bVar6 & 1)) {
                  bVar26 = (lVar14 != 0 && iVar36 == 0) & bVar6;
                  if ((bVar26 != 1) ||
                     (((uint)(uVar33 >> 8) - (uint)(pcVar8->field_0).c[uVar25]) + 4 < 8)) {
                    uVar11 = *(ushort *)
                              (g_etc1_inverse_lookup +
                              (ulong)subblock_pixels[0].field_0.c
                                     [(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                              ::s_next_comp)[uVar25]] * 2 + (ulong)bVar6 * 0x200);
                    uVar3 = *(ushort *)
                             (g_etc1_inverse_lookup +
                             (ulong)subblock_pixels[0].field_0.c[(uint)(&DAT_00195a44)[uVar25]] * 2
                             + (ulong)bVar6 * 0x200);
                    if (((bVar26 == 0) ||
                        ((((uVar11 & 0xff) -
                          (uint)(pcVar8->field_0).c
                                [(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                                         ::s_next_comp)[uVar25]]) + 4 < 8 &&
                         (((uVar3 & 0xff) - (uint)(pcVar8->field_0).c[(uint)(&DAT_00195a44)[uVar25]]
                          ) + 4 < 8)))) &&
                       (uVar27 = (uint)(uVar3 >> 8) * (uint)(uVar3 >> 8) +
                                 (uint)(uVar11 >> 8) * (uint)(uVar11 >> 8) + iVar19 * iVar19,
                       uVar27 < uVar12)) {
                      if (uVar27 == 0) {
                        uVar12 = 0;
                        cVar29 = (component_t)uVar3;
                        local_2b8 = uVar25;
                        local_334 = (uint)uVar33;
                        local_330._0_1_ = (component_t)uVar11;
                        goto LAB_0017f1a3;
                      }
                      local_2b8 = uVar25 & 0xffffffff;
                      local_334 = (uint)uVar33;
                      local_330 = (uint)uVar11;
                      local_32c = (uint)uVar3;
                      uVar12 = uVar27;
                    }
                  }
                }
                uVar33 = *puVar9;
              } while (uVar33 != 0xffff);
            }
          }
          cVar29 = (component_t)local_32c;
          if (uVar12 != 0xffffffff) {
LAB_0017f1a3:
            results[2].m_error = (uint64)(uVar12 << 3);
            results[2].m_n = 8;
            results[2].m_block_color4 = (bool)(~(byte)local_334 & 1);
            results[2].m_block_inten_table = local_334 >> 1 & 7;
            *(ulong *)results[2].m_pSelectors =
                 ((ulong)(byte)((byte)local_334 >> 4) & 3) * 0x101010101010101;
            results[2].m_block_color_unscaled.field_0.c[local_2b8 & 0xffffffff] =
                 (component_t)(local_334 >> 8);
            results[2].m_block_color_unscaled.field_0.c
            [(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                     ::s_next_comp)[local_2b8 & 0xffffffff]] = (component_t)local_330;
            results[2].m_block_color_unscaled.field_0.c
            [(uint)(&pack_etc1_block_solid_color_constrained(crnlib::rg_etc1::etc1_optimizer::results&,unsigned_int,unsigned_char_const*,bool,crnlib::rg_etc1::color_quad_u8_const*)
                     ::s_next_comp)[(int)local_2b8 + 1]] = cVar29;
          }
        }
LAB_0017f21e:
        local_288 = (undefined1)iVar36;
        local_270[0] = lVar14 != 0 && iVar36 == 0;
        if ((bool)local_270[0]) {
          aStack_274 = results[0].m_block_color_unscaled.field_0;
        }
        local_278 = 9;
        local_280 = pack_etc1_block::s_scan_delta_0_to_4;
        if (local_2a0.m_quality != cHighQuality) {
          if (local_2a0.m_quality == cMediumQuality) {
            local_278 = 3;
            local_280 = pack_etc1_block::s_scan_delta_0_to_1;
          }
          else {
            local_278 = 1;
            local_280 = pack_etc1_block::s_scan_delta_0;
          }
        }
        prVar35 = results + lVar14;
        etc1_optimizer::init(&optimizer,(EVP_PKEY_CTX *)&local_2a0);
        bVar37 = etc1_optimizer::compute(&optimizer);
        if (!bVar37) break;
        uVar10 = prVar35->m_error;
        if (0 < (int)local_2a0.m_quality) {
          if (3000 < uVar10) {
            local_278 = 2;
            if (6000 < uVar10) {
              local_278 = 8;
            }
            local_280 = pack_etc1_block::s_scan_delta_5_to_5;
            if (6000 < uVar10) {
              local_280 = pack_etc1_block::s_scan_delta_5_to_8;
            }
            if (local_2a0.m_quality == cMediumQuality) {
              local_278 = 4;
              local_280 = pack_etc1_block::s_scan_delta_2_to_3;
            }
            bVar37 = etc1_optimizer::compute(&optimizer);
            if (!bVar37) break;
            uVar10 = prVar35->m_error;
          }
          uVar4 = results[2].m_error;
          if (results[2].m_error < uVar10) {
            results[lVar14].m_block_color_unscaled.field_0.field_0 =
                 (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad_u8_0_0)
                 results[2].m_block_color_unscaled.field_0;
            results[lVar14].m_block_color4 = results[2].m_block_color4;
            results[lVar14].m_block_inten_table = results[2].m_block_inten_table;
            prVar35->m_error = uVar4;
            memcpy(results[lVar14].m_pSelectors,results[2].m_pSelectors,(ulong)results[2].m_n);
            uVar10 = prVar35->m_error;
          }
        }
        uVar16 = uVar16 + uVar10;
        lVar14 = lVar14 + 1;
      } while (uVar16 < uVar22);
    }
  }
  if (iVar20 == 0) {
    bVar6 = (byte)local_1e0 << 3 |
            (char)((uint)local_1b8 - (uint)(byte)local_1e0) +
            (char)((int)((uint)local_1b8 - (uint)(byte)local_1e0) >> 0x1f) * -8;
    bVar26 = local_1e0._1_1_ << 3 |
             (char)((uint)bStack_1b7 - (uint)local_1e0._1_1_) +
             (char)((int)((uint)bStack_1b7 - (uint)local_1e0._1_1_) >> 0x1f) * -8;
    bVar17 = local_1e0._2_1_ << 3 |
             (char)((uint)bStack_1b6 - (uint)local_1e0._2_1_) +
             (char)((int)((uint)bStack_1b6 - (uint)local_1e0._2_1_) >> 0x1f) * -8;
  }
  else {
    bVar6 = (byte)local_1e0 << 4 | local_1b8;
    bVar26 = local_1e0._1_1_ << 4 | bStack_1b7;
    bVar17 = local_1e0._2_1_ << 4 | bStack_1b6;
  }
  *(byte *)pETC1_block = bVar6;
  *(byte *)((long)pETC1_block + 1) = bVar26;
  *(byte *)((long)pETC1_block + 2) = bVar17;
  *(byte *)((long)pETC1_block + 3) =
       (((char)iVar20 * '\x02' & 2U) + SUB81(_local_1b8,4) * '\x04' | (byte)(local_1e0._4_4_ << 5))
       ^ 2 | (byte)local_34c;
  if (local_34c == 0) {
    uVar11 = 0;
    uVar33 = 0;
    for (uVar12 = 1; -1 < (int)uVar12; uVar12 = uVar12 - 1) {
      pauVar15 = local_1d0[(ulong)uVar12 * 5];
      for (lVar14 = 7; (int)lVar14 != -1; lVar14 = lVar14 + -4) {
        uVar3 = (ushort)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)(*pauVar15)[lVar14]) * 2;
        uVar30 = (ushort)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)pauVar15[-1][lVar14 + 7]
                                  );
        bVar6 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pauVar15[-1][lVar14 + 6]);
        bVar26 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)pauVar15[-1][lVar14 + 5]);
        uVar11 = bVar26 & 1 | (uVar30 & 1 | (uVar3 & 2) + uVar11 * 4) * 4 + (bVar6 & 1) * 2;
        uVar33 = (ushort)(bVar26 >> 1) | bVar6 & 0xfffe |
                 (uVar30 & 0xfffe | uVar33 << 3 | uVar3 & 0xfffc) * 2;
      }
    }
  }
  else {
    uVar27 = 0;
    lVar14 = 0xf;
    uVar12 = 0;
    while( true ) {
      uVar11 = (ushort)uVar27;
      uVar33 = (ushort)uVar12;
      if ((int)(lVar14 - 0xcU) < 0) break;
      uVar16 = lVar14 - 0xcU & 0xffffffff;
      uVar24 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)best_selectors[0][lVar14]) *
               2;
      uVar18 = (uint)*(byte *)((long)&g_selector_index_to_etc1 + (ulong)best_selectors[1][uVar16]);
      bVar6 = *(byte *)((long)&g_selector_index_to_etc1 +
                       (ulong)subblock_pixels[6].field_0.c[lVar14]);
      bVar26 = *(byte *)((long)&g_selector_index_to_etc1 + (ulong)best_selectors[0][uVar16]);
      uVar27 = bVar26 & 1 | (uVar18 & 1 | (uVar24 & 2) + uVar27 * 4) * 4 + (bVar6 & 1) * 2;
      uVar12 = (uint)(bVar26 >> 1) | bVar6 & 0xfffffffe |
               (uVar18 & 0xfffffffe | uVar24 & 0xfffffffc | uVar12 << 3) * 2;
      lVar14 = lVar14 + -1;
    }
  }
  *(char *)((long)pETC1_block + 4) = (char)(uVar33 >> 8);
  *(char *)((long)pETC1_block + 5) = (char)uVar33;
  *(char *)((long)pETC1_block + 6) = (char)(uVar11 >> 8);
  *(char *)((long)pETC1_block + 7) = (char)uVar11;
LAB_0017f6aa:
  return (uint)uVar22;
code_r0x0017ef6f:
  paVar1 = &subblock_pixels[uVar10].field_0;
  uVar10 = (ulong)uVar12;
  if ((anon_union_4_3_dd316fa8_for_color_quad_u8_0)paVar1->m_u32 != subblock_pixels[0].field_0)
  goto LAB_0017f21e;
  goto LAB_0017ef6a;
}

Assistant:

unsigned int pack_etc1_block(void* pETC1_block, const unsigned int* pSrc_pixels_rgba, etc1_pack_params& pack_params) {
  const color_quad_u8* pSrc_pixels = reinterpret_cast<const color_quad_u8*>(pSrc_pixels_rgba);
  etc1_block& dst_block = *static_cast<etc1_block*>(pETC1_block);

  color_quad_u8 src_pixel0(pSrc_pixels[0]);

  // Check for solid block.
  const uint32 first_pixel_u32 = pSrc_pixels->m_u32;
  int r;
  for (r = 15; r >= 1; --r)
    if (pSrc_pixels[r].m_u32 != first_pixel_u32)
      break;
  if (!r)
    return static_cast<unsigned int>(16 * pack_etc1_block_solid_color(dst_block, &pSrc_pixels[0].r));

  color_quad_u8 dithered_pixels[16];
  if (pack_params.m_dithering) {
    dither_block_555(dithered_pixels, pSrc_pixels);
    pSrc_pixels = dithered_pixels;
  }

  etc1_optimizer optimizer;

  uint64 best_error = cUINT64_MAX;
  uint best_flip = false, best_use_color4 = false;

  uint8 best_selectors[2][8];
  etc1_optimizer::results best_results[2];
  for (uint i = 0; i < 2; i++) {
    best_results[i].m_n = 8;
    best_results[i].m_pSelectors = best_selectors[i];
  }

  uint8 selectors[3][8];
  etc1_optimizer::results results[3];

  for (uint i = 0; i < 3; i++) {
    results[i].m_n = 8;
    results[i].m_pSelectors = selectors[i];
  }

  color_quad_u8 subblock_pixels[8];

  etc1_optimizer::params params(pack_params);
  params.m_num_src_pixels = 8;
  params.m_pSrc_pixels = subblock_pixels;

  for (uint flip = 0; flip < 2; flip++) {
    for (uint use_color4 = 0; use_color4 < 2; use_color4++) {
      uint64 trial_error = 0;

      uint subblock;
      for (subblock = 0; subblock < 2; subblock++) {
        if (flip)
          memcpy(subblock_pixels, pSrc_pixels + subblock * 8, sizeof(color_quad_u8) * 8);
        else {
          const color_quad_u8* pSrc_col = pSrc_pixels + subblock * 2;
          subblock_pixels[0] = pSrc_col[0];
          subblock_pixels[1] = pSrc_col[4];
          subblock_pixels[2] = pSrc_col[8];
          subblock_pixels[3] = pSrc_col[12];
          subblock_pixels[4] = pSrc_col[1];
          subblock_pixels[5] = pSrc_col[5];
          subblock_pixels[6] = pSrc_col[9];
          subblock_pixels[7] = pSrc_col[13];
        }

        results[2].m_error = cUINT64_MAX;
        if ((params.m_quality >= cMediumQuality) && ((subblock) || (use_color4))) {
          const uint32 subblock_pixel0_u32 = subblock_pixels[0].m_u32;
          for (r = 7; r >= 1; --r)
            if (subblock_pixels[r].m_u32 != subblock_pixel0_u32)
              break;
          if (!r) {
            pack_etc1_block_solid_color_constrained(results[2], 8, &subblock_pixels[0].r, !use_color4, (subblock && !use_color4) ? &results[0].m_block_color_unscaled : NULL);
          }
        }

        params.m_use_color4 = (use_color4 != 0);
        params.m_constrain_against_base_color5 = false;

        if ((!use_color4) && (subblock)) {
          params.m_constrain_against_base_color5 = true;
          params.m_base_color5 = results[0].m_block_color_unscaled;
        }

        if (params.m_quality == cHighQuality) {
          static const int s_scan_delta_0_to_4[] = {-4, -3, -2, -1, 0, 1, 2, 3, 4};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_4);
          params.m_pScan_deltas = s_scan_delta_0_to_4;
        } else if (params.m_quality == cMediumQuality) {
          static const int s_scan_delta_0_to_1[] = {-1, 0, 1};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0_to_1);
          params.m_pScan_deltas = s_scan_delta_0_to_1;
        } else {
          static const int s_scan_delta_0[] = {0};
          params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_0);
          params.m_pScan_deltas = s_scan_delta_0;
        }

        optimizer.init(params, results[subblock]);
        if (!optimizer.compute())
          break;

        if (params.m_quality >= cMediumQuality) {
          // TODO: Fix fairly arbitrary/unrefined thresholds that control how far away to scan for potentially better solutions.
          const uint refinement_error_thresh0 = 3000;
          const uint refinement_error_thresh1 = 6000;
          if (results[subblock].m_error > refinement_error_thresh0) {
            if (params.m_quality == cMediumQuality) {
              static const int s_scan_delta_2_to_3[] = {-3, -2, 2, 3};
              params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_2_to_3);
              params.m_pScan_deltas = s_scan_delta_2_to_3;
            } else {
              static const int s_scan_delta_5_to_5[] = {-5, 5};
              static const int s_scan_delta_5_to_8[] = {-8, -7, -6, -5, 5, 6, 7, 8};
              if (results[subblock].m_error > refinement_error_thresh1) {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_8);
                params.m_pScan_deltas = s_scan_delta_5_to_8;
              } else {
                params.m_scan_delta_size = RG_ETC1_ARRAY_SIZE(s_scan_delta_5_to_5);
                params.m_pScan_deltas = s_scan_delta_5_to_5;
              }
            }

            if (!optimizer.compute())
              break;
          }

          if (results[2].m_error < results[subblock].m_error)
            results[subblock] = results[2];
        }

        trial_error += results[subblock].m_error;
        if (trial_error >= best_error)
          break;
      }

      if (subblock < 2)
        continue;

      best_error = trial_error;
      best_results[0] = results[0];
      best_results[1] = results[1];
      best_flip = flip;
      best_use_color4 = use_color4;

    }  // use_color4

  }  // flip

  int dr = best_results[1].m_block_color_unscaled.r - best_results[0].m_block_color_unscaled.r;
  int dg = best_results[1].m_block_color_unscaled.g - best_results[0].m_block_color_unscaled.g;
  int db = best_results[1].m_block_color_unscaled.b - best_results[0].m_block_color_unscaled.b;
  RG_ETC1_ASSERT(best_use_color4 || (rg_etc1::minimum(dr, dg, db) >= cETC1ColorDeltaMin) && (rg_etc1::maximum(dr, dg, db) <= cETC1ColorDeltaMax));

  if (best_use_color4) {
    dst_block.m_bytes[0] = static_cast<uint8>(best_results[1].m_block_color_unscaled.r | (best_results[0].m_block_color_unscaled.r << 4));
    dst_block.m_bytes[1] = static_cast<uint8>(best_results[1].m_block_color_unscaled.g | (best_results[0].m_block_color_unscaled.g << 4));
    dst_block.m_bytes[2] = static_cast<uint8>(best_results[1].m_block_color_unscaled.b | (best_results[0].m_block_color_unscaled.b << 4));
  } else {
    if (dr < 0)
      dr += 8;
    dst_block.m_bytes[0] = static_cast<uint8>((best_results[0].m_block_color_unscaled.r << 3) | dr);
    if (dg < 0)
      dg += 8;
    dst_block.m_bytes[1] = static_cast<uint8>((best_results[0].m_block_color_unscaled.g << 3) | dg);
    if (db < 0)
      db += 8;
    dst_block.m_bytes[2] = static_cast<uint8>((best_results[0].m_block_color_unscaled.b << 3) | db);
  }

  dst_block.m_bytes[3] = static_cast<uint8>((best_results[1].m_block_inten_table << 2) | (best_results[0].m_block_inten_table << 5) | ((~best_use_color4 & 1) << 1) | best_flip);

  uint selector0 = 0, selector1 = 0;
  if (best_flip) {
    // flipped:
    // { 0, 0 }, { 1, 0 }, { 2, 0 }, { 3, 0 },
    // { 0, 1 }, { 1, 1 }, { 2, 1 }, { 3, 1 }
    //
    // { 0, 2 }, { 1, 2 }, { 2, 2 }, { 3, 2 },
    // { 0, 3 }, { 1, 3 }, { 2, 3 }, { 3, 3 }
    const uint8* pSelectors0 = best_results[0].m_pSelectors;
    const uint8* pSelectors1 = best_results[1].m_pSelectors;
    for (int x = 3; x >= 0; --x) {
      uint b;
      b = g_selector_index_to_etc1[pSelectors1[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors1[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[4 + x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);

      b = g_selector_index_to_etc1[pSelectors0[x]];
      selector0 = (selector0 << 1) | (b & 1);
      selector1 = (selector1 << 1) | (b >> 1);
    }
  } else {
    // non-flipped:
    // { 0, 0 }, { 0, 1 }, { 0, 2 }, { 0, 3 },
    // { 1, 0 }, { 1, 1 }, { 1, 2 }, { 1, 3 }
    //
    // { 2, 0 }, { 2, 1 }, { 2, 2 }, { 2, 3 },
    // { 3, 0 }, { 3, 1 }, { 3, 2 }, { 3, 3 }
    for (int subblock = 1; subblock >= 0; --subblock) {
      const uint8* pSelectors = best_results[subblock].m_pSelectors + 4;
      for (uint i = 0; i < 2; i++) {
        uint b;
        b = g_selector_index_to_etc1[pSelectors[3]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[2]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[1]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        b = g_selector_index_to_etc1[pSelectors[0]];
        selector0 = (selector0 << 1) | (b & 1);
        selector1 = (selector1 << 1) | (b >> 1);

        pSelectors -= 4;
      }
    }
  }

  dst_block.m_bytes[4] = static_cast<uint8>(selector1 >> 8);
  dst_block.m_bytes[5] = static_cast<uint8>(selector1 & 0xFF);
  dst_block.m_bytes[6] = static_cast<uint8>(selector0 >> 8);
  dst_block.m_bytes[7] = static_cast<uint8>(selector0 & 0xFF);

  return static_cast<unsigned int>(best_error);
}